

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_inflateZstdInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxLevelIndexEntry *__dest;
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  ZSTD_ErrorCode ZVar4;
  void *__src;
  ZSTD_DCtx *dctx;
  ulong uVar5;
  size_t code;
  uint uVar6;
  ktx_error_code_e kVar7;
  long lVar8;
  long lVar9;
  ktx_size_t kVar10;
  ulong __size;
  undefined1 extraout_var [12];
  undefined1 auVar11 [16];
  
  if (pInflatedData == (ktx_uint8_t *)0x0 || pDeflatedData == (ktx_uint8_t *)0x0) {
    kVar7 = KTX_INVALID_VALUE;
  }
  else if (This->supercompressionScheme == KTX_SS_ZSTD) {
    pkVar1 = This->_private;
    __size = (ulong)(This->numLevels * 0x18);
    __src = malloc(__size);
    if (__src == (void *)0x0) {
      kVar7 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
      dctx = ZSTD_createDCtx();
      if (dctx == (ZSTD_DCtx *)0x0) {
        kVar7 = KTX_OUT_OF_MEMORY;
      }
      else {
        __dest = pkVar1->_levelIndex;
        uVar6 = This->numLevels;
        kVar10 = 0;
        lVar9 = 0;
        while (uVar6 = uVar6 - 1, -1 < (int)uVar6) {
          uVar5 = (ulong)(uVar6 & 0x7fffffff);
          lVar8 = uVar5 * 0x18;
          code = ZSTD_decompressDCtx(dctx,pInflatedData + lVar9,inflatedDataCapacity,
                                     pDeflatedData + __dest[uVar5].byteOffset,
                                     pkVar1->_levelIndex[uVar5].byteLength);
          uVar3 = ZSTD_isError(code);
          if (uVar3 != 0) {
            ZVar4 = ZSTD_getErrorCode(code);
            kVar7 = KTX_DECOMPRESS_LENGTH_ERROR;
            if (ZVar4 != ZSTD_error_dstSize_tooSmall) {
              if (ZVar4 == ZSTD_error_memory_allocation) {
                kVar7 = KTX_OUT_OF_MEMORY;
              }
              else if (ZVar4 == ZSTD_error_checksum_wrong) {
                kVar7 = KTX_DECOMPRESS_CHECKSUM_ERROR;
              }
              else {
                kVar7 = KTX_FILE_DATA_ERROR;
              }
            }
            goto LAB_001f1d21;
          }
          if (This->_private->_levelIndex[uVar5].uncompressedByteLength != code) {
            kVar7 = KTX_DECOMPRESS_LENGTH_ERROR;
            goto LAB_001f1d21;
          }
          *(long *)((long)__src + lVar8) = lVar9;
          *(size_t *)((long)__src + lVar8 + 8) = code;
          *(size_t *)((long)__src + lVar8 + 0x10) = code;
          auVar11._0_4_ = (float)code / (float)kVar2;
          auVar11._4_12_ = extraout_var;
          auVar11 = roundss(auVar11,auVar11,10);
          uVar5 = (long)(auVar11._0_4_ * (float)kVar2) & 0xffffffff;
          kVar10 = kVar10 + uVar5;
          lVar9 = lVar9 + uVar5;
          inflatedDataCapacity = inflatedDataCapacity - uVar5;
        }
        This->dataSize = kVar10;
        This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
        memcpy(__dest,__src,__size);
        This->_private->_requiredLevelAlignment = kVar2;
        kVar7 = KTX_SUCCESS;
      }
LAB_001f1d21:
      ZSTD_freeDCtx(dctx);
      free(__src);
    }
  }
  else {
    kVar7 = KTX_INVALID_OPERATION;
  }
  return kVar7;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZstdInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex = NULL;
    ktx_uint32_t uncompressedLevelAlignment;
    ktx_error_code_e result = KTX_SUCCESS;

    ZSTD_DCtx* dctx = NULL;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZSTD)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    dctx = ZSTD_createDCtx();
    if (dctx == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength =
            ZSTD_decompressDCtx(dctx, pInflatedData + levelOffset,
                              inflatedDataCapacity,
                              &pDeflatedData[cindex[level].byteOffset],
                              cindex[level].byteLength);
        if (ZSTD_isError(levelByteLength)) {
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLength);
            switch(error) {
              case ZSTD_error_dstSize_tooSmall:
                result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                goto cleanup;
              case ZSTD_error_checksum_wrong:
                result = KTX_DECOMPRESS_CHECKSUM_ERROR;
                goto cleanup;
              case ZSTD_error_memory_allocation:
                result =  KTX_OUT_OF_MEMORY;
                goto cleanup;
             default:
                result = KTX_FILE_DATA_ERROR;
                goto cleanup;
            }
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

cleanup:
    ZSTD_freeDCtx(dctx);
    free(nindex);
    return result;
}